

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Preferences.cxx
# Opt level: O2

char __thiscall Fl_Preferences::set(Fl_Preferences *this,char *key,char *text)

{
  char cVar1;
  byte bVar2;
  long lVar3;
  byte *value;
  byte *pbVar4;
  int iVar5;
  char *pcVar6;
  int iVar7;
  
  pcVar6 = "";
  if (text != (char *)0x0) {
    pcVar6 = text;
  }
  iVar5 = 0;
  for (lVar3 = 0; cVar1 = pcVar6[lVar3], cVar1 != '\0'; lVar3 = lVar3 + 1) {
    iVar7 = iVar5 + 4;
    if ((byte)(cVar1 + 0x81U) < 0xa1) {
      iVar5 = iVar7;
    }
    if (cVar1 == '\\') {
      iVar5 = iVar7;
    }
  }
  if (iVar5 == 0) {
    Node::set(this->node,key,text);
    return '\x01';
  }
  value = (byte *)malloc((long)((int)lVar3 + iVar5 + 1));
  pbVar4 = value;
  do {
    bVar2 = *text;
    if (bVar2 == 10) {
      pbVar4[0] = 0x5c;
      pbVar4[1] = 0x6e;
LAB_001c2406:
      pbVar4 = pbVar4 + 2;
    }
    else {
      if (bVar2 == 0xd) {
        pbVar4[0] = 0x5c;
        pbVar4[1] = 0x72;
        goto LAB_001c2406;
      }
      if (bVar2 == 0x5c) {
        pbVar4[0] = 0x5c;
        pbVar4[1] = 0x5c;
        goto LAB_001c2406;
      }
      if (bVar2 == 0) {
        *pbVar4 = 0;
        Node::set(this->node,key,(char *)value);
        free(value);
        return '\x01';
      }
      if ((byte)(bVar2 + 0x81) < 0xa1) {
        *pbVar4 = 0x5c;
        pbVar4[1] = bVar2 >> 6 | 0x30;
        pbVar4[2] = bVar2 >> 3 & 7 | 0x30;
        pbVar4[3] = bVar2 & 7 | 0x30;
        pbVar4 = pbVar4 + 4;
      }
      else {
        *pbVar4 = bVar2;
        pbVar4 = pbVar4 + 1;
      }
    }
    text = (char *)((byte *)text + 1);
  } while( true );
}

Assistant:

char Fl_Preferences::set( const char *key, const char *text ) {
  const char *s = text ? text : "";
  int n=0, ns=0;
  for ( ; *s; s++ ) { n++; if ( *s<32 || *s=='\\' || *s==0x7f ) ns+=4; }
  if ( ns ) {
    char *buffer = (char*)malloc( n+ns+1 ), *d = buffer;
    for ( s=text; *s; ) {
      char c = *s;
      if ( c=='\\' ) { *d++ = '\\'; *d++ = '\\'; s++; }
      else if ( c=='\n' ) { *d++ = '\\'; *d++ = 'n'; s++; }
      else if ( c=='\r' ) { *d++ = '\\'; *d++ = 'r'; s++; }
      else if ( c<32 || c==0x7f )
	{ *d++ = '\\'; *d++ = '0'+((c>>6)&3); *d++ = '0'+((c>>3)&7); *d++ = '0'+(c&7);  s++; }
      else *d++ = *s++;
    }
    *d = 0;
    node->set( key, buffer );
    free( buffer );
  }
  else
    node->set( key, text );
  return 1;
}